

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddNumberError(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                 *this,ValidateErrorCode code,ValueType *actual,SValue *expected,
                _func_ValueType_ptr *exclusive)

{
  ValueType *this_00;
  StringRefType *pSVar1;
  CrtAllocator *pCVar2;
  ValueType *rhs;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> GStack_68;
  ValidateErrorCode local_54;
  StringRefType local_50;
  StringRefType local_40;
  
  this_00 = &this->currentError_;
  local_54 = code;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetObject(this_00);
  pSVar1 = GetActualString();
  local_40.s = pSVar1->s;
  local_40.length = pSVar1->length;
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (this_00,&local_40,actual,pCVar2);
  pSVar1 = GetExpectedString();
  local_50.s = pSVar1->s;
  local_50.length = pSVar1->length;
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericValue<rapidjson::CrtAllocator>(&GStack_68,expected,pCVar2,false);
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (this_00,&local_50,&GStack_68,pCVar2);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&GStack_68);
  if (exclusive != (_func_ValueType_ptr *)0x0) {
    rhs = (*exclusive)();
    pCVar2 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
    GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)&GStack_68,rhs,pCVar2,
               false);
    pCVar2 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember<bool>
              (this_00,&GStack_68,true,pCVar2);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&GStack_68);
  }
  AddCurrentError(this,local_54,false);
  return;
}

Assistant:

void AddNumberError(const ValidateErrorCode code, ValueType& actual, const SValue& expected,
        const typename SchemaType::ValueType& (*exclusive)() = 0) {
        currentError_.SetObject();
        currentError_.AddMember(GetActualString(), actual, GetStateAllocator());
        currentError_.AddMember(GetExpectedString(), ValueType(expected, GetStateAllocator()).Move(), GetStateAllocator());
        if (exclusive)
            currentError_.AddMember(ValueType(exclusive(), GetStateAllocator()).Move(), true, GetStateAllocator());
        AddCurrentError(code);
    }